

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson_cursor.hpp
# Opt level: O0

void __thiscall
jsoncons::bson::basic_bson_cursor<jsoncons::bytes_source,_std::allocator<char>_>::reset
          (basic_bson_cursor<jsoncons::bytes_source,_std::allocator<char>_> *this)

{
  ulong uVar1;
  long *in_RDI;
  basic_bson_parser<jsoncons::bytes_source,_std::allocator<char>_> *unaff_retaddr;
  basic_staj_visitor<char> *in_stack_00000030;
  
  basic_bson_parser<jsoncons::bytes_source,_std::allocator<char>_>::reset(unaff_retaddr);
  basic_staj_visitor<char>::reset(in_stack_00000030);
  *(undefined1 *)(in_RDI + 0x23) = 0;
  uVar1 = (**(code **)(*in_RDI + 0x18))();
  if ((uVar1 & 1) == 0) {
    (**(code **)(*in_RDI + 0x38))();
  }
  return;
}

Assistant:

void reset()
    {
        parser_.reset();
        cursor_visitor_.reset();
        eof_ = false;
        if (!done())
        {
            next();
        }
    }